

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CNegativeExpression *exp)

{
  initializer_list<INode_*> __l;
  allocator local_f9;
  string local_f8 [32];
  ChildrenAnswers local_d8;
  vector<INode_*,_std::allocator<INode_*>_> local_a8;
  undefined1 local_90 [8];
  ChildrenAnswers answers;
  allocator<INode_*> local_49;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CNegativeExpression *exp_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)exp;
  local_48 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get(&exp->expression);
  local_40 = &local_48;
  local_38 = 1;
  std::allocator<INode_*>::allocator(&local_49);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_49);
  std::allocator<INode_*>::~allocator(&local_49);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_a8,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_90,this,&local_a8);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_a8);
  ChildrenAnswers::ChildrenAnswers(&local_d8,(ChildrenAnswers *)local_90);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_d8);
  ChildrenAnswers::~ChildrenAnswers(&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Negative",&local_f9);
  AddLabel(this,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_90);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CNegativeExpression &exp)
{
	std::vector<INode*> children = { exp.expression.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("Negative");
	++lastVisited;	
}